

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall pbrt::BinaryWriter::BinaryWriter(BinaryWriter *this,ostream *str)

{
  _Rb_tree_header *p_Var1;
  int32_t formatTag;
  
  std::
  stack<std::shared_ptr<pbrt::SerializedEntity>,std::deque<std::shared_ptr<pbrt::SerializedEntity>,std::allocator<std::shared_ptr<pbrt::SerializedEntity>>>>
  ::
  stack<std::deque<std::shared_ptr<pbrt::SerializedEntity>,std::allocator<std::shared_ptr<pbrt::SerializedEntity>>>,void>
            (&this->serializedEntity);
  this->binStream = str;
  p_Var1 = &(this->emittedEntity)._M_t._M_impl.super__Rb_tree_header;
  (this->emittedEntity)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->emittedEntity)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->emittedEntity)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->emittedEntity)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->emittedEntity)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::ostream::write((char *)str,(long)&formatTag);
  return;
}

Assistant:

BinaryWriter(std::ostream& str)
      : binStream(str)
    {
      int32_t formatTag = ourFormatTag;
      binStream.write((char*)&formatTag,sizeof(formatTag));
    }